

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  reference pixels;
  byte *pbVar9;
  reference pvVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int local_98;
  int local_94;
  int i_1;
  int j;
  float local_88 [2];
  int local_80;
  allocator<unsigned_char> local_79;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator<tcu::Vector<float,_4>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vec4 *expected_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ComputeShaderBase *this_local;
  
  display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = expected;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48,
             (long)(w * h),&local_49);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_49);
  std::allocator<unsigned_char>::allocator(&local_79);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(long)(w * h * 4),&local_79
            );
  std::allocator<unsigned_char>::~allocator(&local_79);
  pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,x,y,w,h,0x1908,0x1401,
             pixels);
  for (local_80 = 0; local_80 < w * h * 4; local_80 = local_80 + 4) {
    pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(long)local_80);
    bVar5 = *pbVar9;
    pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                        (long)(local_80 + 1));
    bVar6 = *pbVar9;
    pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                        (long)(local_80 + 2));
    bVar7 = *pbVar9;
    pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                        (long)(local_80 + 3));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&i_1,(float)bVar5 / 255.0,(float)bVar6 / 255.0,
               (float)bVar7 / 255.0,(float)*pbVar9 / 255.0);
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_48,(long)(local_80 / 4));
    *(undefined8 *)pvVar10->m_data = _i_1;
    *(float (*) [2])(pvVar10->m_data + 2) = local_88;
  }
  local_94 = 0;
  do {
    if (h <= local_94) {
      this_local._7_1_ = true;
LAB_01427742:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48)
      ;
      return this_local._7_1_;
    }
    for (local_98 = 0; local_98 < w; local_98 = local_98 + 1) {
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_48,(long)(local_94 * w + local_98));
      bVar8 = ColorEqual(this,pvVar10,
                         display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->g_color_eps);
      if (!bVar8) {
        pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_48,(long)(local_94 * w + local_98));
        pfVar11 = tcu::Vector<float,_4>::x(pvVar10);
        fVar1 = *pfVar11;
        pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_48,(long)(local_94 * w + local_98));
        pfVar11 = tcu::Vector<float,_4>::y(pvVar10);
        fVar2 = *pfVar11;
        pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_48,(long)(local_94 * w + local_98));
        pfVar11 = tcu::Vector<float,_4>::z(pvVar10);
        fVar3 = *pfVar11;
        pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_48,(long)(local_94 * w + local_98));
        pfVar11 = tcu::Vector<float,_4>::w(pvVar10);
        fVar4 = *pfVar11;
        fVar12 = tcu::Vector<float,_4>::x
                           (display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fVar13 = tcu::Vector<float,_4>::y
                           (display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fVar14 = tcu::Vector<float,_4>::z
                           (display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fVar15 = tcu::Vector<float,_4>::w
                           (display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown_0::Output
                  ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                   (double)fVar1,(double)fVar2,(double)fVar3,(double)fVar4,(double)fVar12,
                   (double)fVar13,(double)fVar14,(double)fVar15,(ulong)(uint)(x + local_98),
                   (ulong)(uint)(y + local_94));
        this_local._7_1_ = false;
        goto LAB_01427742;
      }
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4>	display(w * h);
		std::vector<GLubyte> data(w * h * 4);
		glReadPixels(x, y, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < w * h * 4; i += 4)
		{
			display[i / 4] = vec4(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
								  static_cast<GLfloat>(data[i + 2] / 255.), static_cast<GLfloat>(data[i + 3] / 255.));
		}

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}